

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferParameters.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferParameters::TextureBufferParameters
          (TextureBufferParameters *this,Context *context,ExtParameters *extParams,char *name,
          char *description)

{
  char *description_local;
  char *name_local;
  ExtParameters *extParams_local;
  Context *context_local;
  TextureBufferParameters *this_local;
  
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBufferParameters_032632d8;
  std::map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  ::map(&this->m_internal_formats);
  this->m_tbo_id = 0;
  this->m_to_id = 0;
  return;
}

Assistant:

TextureBufferParameters::TextureBufferParameters(Context& context, const ExtParameters& extParams, const char* name,
												 const char* description)
	: TestCaseBase(context, extParams, name, description), m_tbo_id(0), m_to_id(0)
{
}